

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O0

SPxId __thiscall soplex::SPxDevexPR<double>::selectEnterX(SPxDevexPR<double> *this,double tol)

{
  bool bVar1;
  int iVar2;
  SPxBasisBase<double> *pSVar3;
  long in_RDI;
  double *unaff_retaddr;
  SPxDevexPR<double> *in_stack_00000008;
  double bestCo;
  double best;
  SPxId enterCoId;
  SPxId enterId;
  DataKey local_68;
  DataKey local_60;
  DataKey local_58;
  undefined8 in_stack_ffffffffffffffb0;
  DataKey in_stack_ffffffffffffffb8;
  DataKey in_stack_ffffffffffffffc0;
  SPxDevexPR<double> *this_00;
  DataKey local_28;
  DataKey local_20 [3];
  double in_stack_fffffffffffffff8;
  
  SPxId::SPxId((SPxId *)0x2e31a3);
  SPxId::SPxId((SPxId *)0x2e31ad);
  this_00 = (SPxDevexPR<double> *)0x0;
  *(undefined8 *)(in_RDI + 0x38) = 0x3ff0000000000000;
  *(undefined8 *)(in_RDI + 0x38) = 0x3ff0000000000000;
  if (((*(byte *)(*(long *)(in_RDI + 0x10) + 0x89c) & 1) == 0) ||
     ((*(byte *)(in_RDI + 0xb0) & 1) != 0)) {
    if (((*(byte *)(*(long *)(in_RDI + 0x10) + 0x899) & 1) == 0) ||
       ((*(byte *)(in_RDI + 0xb0) & 1) != 0)) {
      local_60 = (DataKey)selectEnterDenseDim((SPxDevexPR<double> *)0x0,
                                              (double *)in_stack_ffffffffffffffc0,
                                              (double)in_stack_ffffffffffffffb8,
                                              (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                                              (int)in_stack_ffffffffffffffb0);
    }
    else {
      local_60 = (DataKey)selectEnterSparseDim
                                    ((SPxDevexPR<double> *)0x0,(double *)in_stack_ffffffffffffffc0,
                                     (double)in_stack_ffffffffffffffb8);
    }
    local_28 = local_60;
    if (((*(byte *)(*(long *)(in_RDI + 0x10) + 0x89a) & 1) == 0) ||
       ((*(byte *)(in_RDI + 0xb0) & 1) != 0)) {
      local_68 = (DataKey)selectEnterDenseCoDim
                                    (this_00,(double *)in_stack_ffffffffffffffc0,
                                     (double)in_stack_ffffffffffffffb8,
                                     (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                                     (int)in_stack_ffffffffffffffb0);
    }
    else {
      local_68 = (DataKey)selectEnterSparseCoDim
                                    (this_00,(double *)in_stack_ffffffffffffffc0,
                                     (double)in_stack_ffffffffffffffb8);
    }
    local_20[0] = local_68;
    goto LAB_002e349b;
  }
  iVar2 = IdxSet::size((IdxSet *)(in_RDI + 0x70));
  if (iVar2 < 2) {
LAB_002e322f:
    if ((*(byte *)(*(long *)(in_RDI + 0x10) + 0x899) & 1) == 0) {
      in_stack_ffffffffffffffc0 =
           (DataKey)selectEnterDenseDim(this_00,(double *)in_stack_ffffffffffffffc0,
                                        (double)in_stack_ffffffffffffffb8,
                                        (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                                        (int)in_stack_ffffffffffffffb0);
      local_28 = in_stack_ffffffffffffffc0;
    }
    else {
      in_stack_ffffffffffffffc0 =
           (DataKey)buildBestPriceVectorEnterDim
                              (in_stack_00000008,unaff_retaddr,in_stack_fffffffffffffff8);
      local_28 = in_stack_ffffffffffffffc0;
    }
  }
  else {
    pSVar3 = SPxSolverBase<double>::basis(*(SPxSolverBase<double> **)(in_RDI + 0x10));
    iVar2 = SPxBasisBase<double>::lastUpdate(pSVar3);
    if (iVar2 == 0) goto LAB_002e322f;
    if ((*(byte *)(*(long *)(in_RDI + 0x10) + 0x899) & 1) == 0) {
      in_stack_ffffffffffffffb8 =
           (DataKey)selectEnterDenseDim(this_00,(double *)in_stack_ffffffffffffffc0,
                                        (double)in_stack_ffffffffffffffb8,
                                        (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                                        (int)in_stack_ffffffffffffffb0);
      local_28 = in_stack_ffffffffffffffb8;
    }
    else {
      in_stack_ffffffffffffffb8 =
           (DataKey)selectEnterHyperDim(this_00,(double *)in_stack_ffffffffffffffc0,
                                        (double)in_stack_ffffffffffffffb8);
      local_28 = in_stack_ffffffffffffffb8;
    }
  }
  iVar2 = IdxSet::size((IdxSet *)(in_RDI + 0x90));
  if (1 < iVar2) {
    pSVar3 = SPxSolverBase<double>::basis(*(SPxSolverBase<double> **)(in_RDI + 0x10));
    iVar2 = SPxBasisBase<double>::lastUpdate(pSVar3);
    if (iVar2 != 0) {
      if ((*(byte *)(*(long *)(in_RDI + 0x10) + 0x89a) & 1) == 0) {
        local_58 = (DataKey)selectEnterDenseCoDim
                                      (this_00,(double *)in_stack_ffffffffffffffc0,
                                       (double)in_stack_ffffffffffffffb8,
                                       (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                                       (int)in_stack_ffffffffffffffb0);
      }
      else {
        local_58 = (DataKey)selectEnterHyperCoDim
                                      (this_00,(double *)in_stack_ffffffffffffffc0,
                                       (double)in_stack_ffffffffffffffb8);
      }
      local_20[0] = local_58;
      goto LAB_002e349b;
    }
  }
  if ((*(byte *)(*(long *)(in_RDI + 0x10) + 0x89a) & 1) == 0) {
    local_20[0] = (DataKey)selectEnterDenseCoDim
                                     (this_00,(double *)in_stack_ffffffffffffffc0,
                                      (double)in_stack_ffffffffffffffb8,
                                      (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                                      (int)in_stack_ffffffffffffffb0);
  }
  else {
    local_20[0] = (DataKey)buildBestPriceVectorEnterCoDim
                                     (in_stack_00000008,unaff_retaddr,in_stack_fffffffffffffff8);
  }
LAB_002e349b:
  bVar1 = SPxId::isValid((SPxId *)&local_28);
  if ((!bVar1) ||
     ((0.0 <= (double)this_00 * 0.8 && (bVar1 = SPxId::isValid((SPxId *)local_20), bVar1)))) {
    local_28 = local_20[0];
  }
  return (SPxId)local_28;
}

Assistant:

SPxId SPxDevexPR<R>::selectEnterX(R tol)
{
   SPxId enterId;
   SPxId enterCoId;
   R best;
   R bestCo;

   best = 0;
   bestCo = 0;
   last = 1.0;

   // avoid uninitialized value later on in entered4X()
   last = 1.0;

   if(this->thesolver->hyperPricingEnter && !refined)
   {
      if(bestPrices.size() < 2 || this->thesolver->basis().lastUpdate() == 0)
         enterCoId = (this->thesolver->sparsePricingEnter) ? buildBestPriceVectorEnterDim(best,
                     tol) : selectEnterDenseDim(best, tol);
      else
         enterCoId = (this->thesolver->sparsePricingEnter) ? selectEnterHyperDim(best,
                     tol) : selectEnterDenseDim(best, tol);

      if(bestPricesCo.size() < 2 || this->thesolver->basis().lastUpdate() == 0)
         enterId = (this->thesolver->sparsePricingEnterCo) ? buildBestPriceVectorEnterCoDim(bestCo,
                   tol) : selectEnterDenseCoDim(bestCo, tol);
      else
         enterId = (this->thesolver->sparsePricingEnterCo) ? selectEnterHyperCoDim(bestCo,
                   tol) : selectEnterDenseCoDim(bestCo, tol);
   }
   else
   {
      enterCoId = (this->thesolver->sparsePricingEnter
                   && !refined) ? selectEnterSparseDim(best, tol) : selectEnterDenseDim(best, tol);
      enterId = (this->thesolver->sparsePricingEnterCo
                 && !refined) ? selectEnterSparseCoDim(bestCo, tol) : selectEnterDenseCoDim(bestCo, tol);
   }

   // prefer coIds to increase the number of unit vectors in the basis matrix, i.e., rows in colrep and cols in rowrep
   if(enterCoId.isValid() && (best > SOPLEX_SPARSITY_TRADEOFF * bestCo || !enterId.isValid()))
      return enterCoId;
   else
      return enterId;
}